

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O3

void do_macro(int *ip)

{
  char cVar1;
  ushort *puVar2;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  
  if (pass == 1) {
    println();
  }
  else {
    if (expand_macro != 0) {
      pcVar5 = "Can not nest macro definitions!";
LAB_0010d477:
      error(pcVar5);
      return;
    }
    if (lablptr == (t_symbol *)0x0) {
      ppuVar4 = __ctype_b_loc();
      puVar2 = *ppuVar4;
      iVar3 = *ip;
      if ((*(byte *)((long)puVar2 + (long)prlnbuf[iVar3] * 2 + 1) & 0x20) != 0) {
        pcVar5 = prlnbuf + (long)iVar3 + 1;
        do {
          iVar3 = iVar3 + 1;
          *ip = iVar3;
          cVar1 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        } while ((*(byte *)((long)puVar2 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      }
      iVar3 = colsym(ip);
      if (iVar3 == 0) {
        pcVar5 = "No name for this macro!";
        goto LAB_0010d477;
      }
      lablptr = stlook(1);
      if (lablptr == (t_symbol *)0x0) {
        return;
      }
    }
    if (lablptr->refcnt != 0) {
      if (lablptr->type == 6) {
        pcVar5 = "Symbol already used by a function!";
      }
      else if (lablptr->type == 5) {
        pcVar5 = "Macro already defined!";
      }
      else {
        pcVar5 = "Symbol already used by a label!";
      }
      fatal_error(pcVar5);
      return;
    }
    iVar3 = check_eol(ip);
    if (iVar3 == 0) {
      return;
    }
    iVar3 = macro_install();
    if (iVar3 == 0) {
      return;
    }
  }
  in_macro = 1;
  return;
}

Assistant:

void
do_macro(int *ip)
{
	if (pass == LAST_PASS)
		println();
	else {
		/* error checking */
		if (expand_macro) {
			error("Can not nest macro definitions!");
			return;
		}
		if (lablptr == NULL) {
			/* skip spaces */
			while (isspace(prlnbuf[*ip]))
				(*ip)++;

			/* search a label after the .macro */
			if (colsym(ip) == 0) {
				error("No name for this macro!");
				return;
			}

			/* put the macro name in the symbol table */
			if ((lablptr = stlook(1)) == NULL)
				return;
		}
		if (lablptr->refcnt) {
			switch (lablptr->type) {
			case MACRO:
				fatal_error("Macro already defined!");
				return;

			case FUNC:
				fatal_error("Symbol already used by a function!");
				return;

			default:
				fatal_error("Symbol already used by a label!");
				return;
			}
		}
		if (!check_eol(ip))
			return;

		/* install this new macro in the hash table */
		if (!macro_install())
			return;
	}
	in_macro = 1;
}